

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O0

uint embree::addCube(RTCScene scene_i)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 in_RDI;
  uint geomID;
  uint i;
  float *level;
  RTCGeometry geom;
  uint local_1c;
  
  uVar2 = rtcNewGeometry(g_device,8);
  rtcSetSharedGeometryBuffer(uVar2,1,0,0x9003,cube_vertices,0,0x10,8);
  rtcSetSharedGeometryBuffer(uVar2,0,0,0x5001,cube_indices,0,4,0x18);
  rtcSetSharedGeometryBuffer(uVar2,0x10,0,0x5001,cube_faces,0,4,6);
  rtcSetGeometryVertexAttributeCount(uVar2,1);
  rtcSetSharedGeometryBuffer(uVar2,2,0,0x9003,cube_colors,0,0x10,8);
  lVar3 = rtcSetNewGeometryBuffer(uVar2,0x11,0,0x9001,4,0x18);
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    *(undefined4 *)(lVar3 + (ulong)local_1c * 4) = 0x43800000;
  }
  rtcCommitGeometry(uVar2);
  uVar1 = rtcAttachGeometry(in_RDI,uVar2);
  rtcReleaseGeometry(uVar2);
  return uVar1;
}

Assistant:

unsigned int addCube (RTCScene scene_i)
{
  /* create a triangulated cube with 6 quads and 8 vertices */
  RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_SUBDIVISION);

  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, cube_vertices, 0, sizeof(Vec3fa), 8);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT, cube_indices, 0, sizeof(unsigned int), NUM_INDICES);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE, 0, RTC_FORMAT_UINT, cube_faces, 0, sizeof(unsigned int), NUM_FACES);

  /* edge and vertex creases disabled */
#if 0  
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_INDEX,    0, RTC_FORMAT_UINT2, cube_edge_crease_indices,   0, 2*sizeof(unsigned int), 12);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT,   0, RTC_FORMAT_FLOAT, cube_edge_crease_weights,   0, sizeof(float), 12);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX,  0, RTC_FORMAT_UINT,  cube_vertex_crease_indices, 0, sizeof(unsigned int), 8);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT, 0, RTC_FORMAT_FLOAT, cube_vertex_crease_weights, 0, sizeof(float), 8);
#endif
  
  rtcSetGeometryVertexAttributeCount(geom,1);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE, 0, RTC_FORMAT_FLOAT3, cube_colors, 0, sizeof(Vec3fa), 8);

  float* level = (float*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_LEVEL, 0, RTC_FORMAT_FLOAT, sizeof(float), NUM_INDICES);
  for (unsigned int i=0; i<NUM_INDICES; i++)
    level[i] = EDGE_LEVEL;

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene_i, geom);
  rtcReleaseGeometry(geom);
  return geomID;
}